

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O0

bool __thiscall COLLADASaxFWL::MeshLoader::initializePositionsOffset(MeshLoader *this)

{
  bool bVar1;
  String *pSVar2;
  SourceBase *this_00;
  unsigned_long_long uVar3;
  size_t sVar4;
  long in_RDI;
  unsigned_long_long stride;
  SourceBase *sourceBase;
  String sourceId;
  URI inputUrl;
  InputShared *positionInput;
  bool has_errors;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  byte bVar5;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  SourceArrayLoader *in_stack_fffffffffffffdf8;
  allocator<char> *in_stack_fffffffffffffe10;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  URI *this_01;
  allocator<char> local_1b1;
  string local_1b0 [23];
  undefined1 in_stack_fffffffffffffe67;
  URI *in_stack_fffffffffffffe68;
  URI *in_stack_fffffffffffffe70;
  allocator<char> local_181;
  string local_180 [32];
  SourceBase *local_160;
  string local_158 [4];
  Severity in_stack_fffffffffffffeac;
  String *in_stack_fffffffffffffeb0;
  ErrorType in_stack_fffffffffffffebc;
  IFilePartLoader *in_stack_fffffffffffffec0;
  URI local_138;
  allocator<char> local_39;
  string local_38 [32];
  InputShared *local_18;
  byte local_9;
  
  local_9 = 0;
  local_18 = MeshPrimitiveInputList::getPositionInput
                       ((MeshPrimitiveInputList *)
                        CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  if (local_18 == (InputShared *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    bVar1 = IFilePartLoader::handleFWLError
                      (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb0
                       ,in_stack_fffffffffffffeac);
    local_9 = (local_9 & 1) != 0 || bVar1;
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  else {
    uVar3 = InputShared::getOffset(local_18);
    *(unsigned_long_long *)(in_RDI + 0x1d0) = uVar3;
  }
  InputUnshared::getSource(&local_18->super_InputUnshared);
  this_01 = &local_138;
  COLLADABU::URI::URI(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                      (bool)in_stack_fffffffffffffe67);
  pSVar2 = COLLADABU::URI::getFragment_abi_cxx11_(this_01);
  std::__cxx11::string::string(local_158,(string *)pSVar2);
  this_00 = SourceArrayLoader::getSourceById
                      (in_stack_fffffffffffffdf8,
                       (String *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
  local_160 = this_00;
  if (this_00 == (SourceBase *)0x0) {
    __a = &local_181;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(&this_01->mUriString,(char *)this_00,__a);
    bVar1 = IFilePartLoader::handleFWLError
                      (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb0
                       ,in_stack_fffffffffffffeac);
    local_9 = (local_9 & 1) != 0 || bVar1;
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator(&local_181);
  }
  else {
    uVar3 = SourceBase::getStride(this_00);
    if (uVar3 != 3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&this_01->mUriString,(char *)this_00,in_stack_fffffffffffffe10);
      bVar1 = IFilePartLoader::handleFWLError
                        (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                         in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
      local_9 = (local_9 & 1) != 0 || bVar1;
      std::__cxx11::string::~string(local_1b0);
      std::allocator<char>::~allocator(&local_1b1);
    }
    sVar4 = SourceBase::getInitialIndex(local_160);
    *(int *)(in_RDI + 0x1d8) = (int)sVar4;
  }
  bVar5 = local_9;
  std::__cxx11::string::~string(local_158);
  COLLADABU::URI::~URI((URI *)CONCAT17(bVar5,in_stack_fffffffffffffde0));
  return (bool)(bVar5 & 1);
}

Assistant:

bool MeshLoader::initializePositionsOffset ()
    {
        bool has_errors = false;
        const InputShared* positionInput = mMeshPrimitiveInputs.getPositionInput ();
        COLLADABU_ASSERT ( positionInput != 0 );
        if (positionInput == 0) {
            has_errors |= handleFWLError(SaxFWLError::ERROR_DATA_NOT_VALID, "No positions, can't import!", IError::SEVERITY_CRITICAL);
        }
        else {
            // Get the offset value, the initial index values and alloc the memory.
            mPositionsOffset = positionInput->getOffset();
        }

        COLLADABU::URI inputUrl = positionInput->getSource ();
        String sourceId = inputUrl.getFragment ();
        const SourceBase* sourceBase = getSourceById ( sourceId );
        COLLADABU_ASSERT ( sourceBase != 0 );
        if ( sourceBase == 0 )
            has_errors |= handleFWLError(SaxFWLError::ERROR_DATA_NOT_VALID, "Positions sourceBase is null.", IError::SEVERITY_CRITICAL);
        else {
            // only stride 3 makes sense for normals
            unsigned long long stride = sourceBase->getStride();
            if (stride != 3)
                has_errors |= handleFWLError(SaxFWLError::ERROR_DATA_NOT_VALID, "Positios stride is not three.", IError::SEVERITY_CRITICAL);

            mPositionsIndexOffset = (unsigned int)sourceBase->getInitialIndex();
        }
        return has_errors;
    }